

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

void __thiscall
llvm::detail::IEEEFloat::toString
          (IEEEFloat *this,SmallVectorImpl<char> *Str,uint FormatPrecision,uint FormatMaxPadding,
          bool TruncateZero)

{
  byte bVar1;
  short sVar2;
  long lVar3;
  SmallVectorImpl<char> *pSVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  uint64_t uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  Significand *pSVar13;
  char *pcVar14;
  undefined3 in_register_00000081;
  undefined1 uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double __x;
  ArrayRef<unsigned_long> bigVal;
  APInt significand;
  APInt powten;
  APInt ten;
  APInt digit;
  SmallVector<char,_256U> buffer;
  byte local_1a1;
  anon_union_8_2_1313ab2f_for_U local_1a0;
  uint local_198;
  anon_union_8_2_1313ab2f_for_U local_190;
  undefined8 local_188;
  undefined1 local_180 [8];
  uint local_178;
  undefined4 local_174;
  ulong local_170;
  SmallVectorImpl<char> *local_168;
  anon_union_8_2_1313ab2f_for_U local_160;
  uint local_158;
  anon_union_8_2_1313ab2f_for_U local_150;
  uint local_148;
  anon_union_8_2_1313ab2f_for_U local_140;
  ulong local_138;
  char local_130 [256];
  
  local_174 = CONCAT31(in_register_00000081,TruncateZero);
  uVar18 = (ulong)FormatPrecision;
  bVar1 = this->field_0x12;
  if ((bVar1 & 7) == 3) {
    if ((bVar1 & 8) != 0) {
      local_140.VAL._0_1_ = 0x2d;
      SmallVectorTemplateBase<char,_true>::push_back
                (&Str->super_SmallVectorTemplateBase<char,_true>,(char *)&local_140.VAL);
    }
    if (FormatMaxPadding != 0) {
      local_140.VAL._0_1_ = 0x30;
      SmallVectorTemplateBase<char,_true>::push_back
                (&Str->super_SmallVectorTemplateBase<char,_true>,(char *)&local_140.VAL);
      return;
    }
    if (TruncateZero) {
      pcVar14 = "0.0E+0";
      pcVar12 = "";
    }
    else {
      SmallVectorImpl<char>::append<char_const*,void>(Str,"0.0","");
      if (1 < FormatPrecision) {
        local_140.VAL._0_1_ = 0x30;
        SmallVectorImpl<char>::append(Str,(ulong)(FormatPrecision - 1),(char *)&local_140.VAL);
      }
      pcVar14 = "e+00";
      pcVar12 = "";
    }
    SmallVectorImpl<char>::append<char_const*,void>(Str,pcVar14,pcVar12);
    return;
  }
  if ((bVar1 & 7) == 1) {
    pcVar14 = "NaN";
    pcVar12 = "";
LAB_0019337f:
    SmallVectorImpl<char>::append<char_const*,void>(Str,pcVar14,pcVar12);
    return;
  }
  if ((bVar1 & 7) == 0) {
    if ((bVar1 & 8) == 0) {
      pcVar14 = "+Inf";
      pcVar12 = "";
    }
    else {
      pcVar14 = "-Inf";
      pcVar12 = "";
    }
    goto LAB_0019337f;
  }
  if ((bVar1 & 8) != 0) {
    local_140.VAL._0_1_ = 0x2d;
    SmallVectorTemplateBase<char,_true>::push_back
              (&Str->super_SmallVectorTemplateBase<char,_true>,(char *)&local_140.VAL);
  }
  uVar17 = this->semantics->precision;
  if (uVar17 - 0x40 < 0xffffff80) {
    pSVar13 = (Significand *)(this->significand).part;
  }
  else {
    pSVar13 = &this->significand;
  }
  sVar2 = this->exponent;
  bigVal.Length._0_4_ = uVar17 + 0x3f >> 6;
  bigVal.Data = (unsigned_long *)pSVar13;
  bigVal.Length._4_4_ = 0;
  local_178 = FormatMaxPadding;
  local_168 = Str;
  APInt::APInt((APInt *)&local_1a0,uVar17,bigVal);
  if (FormatPrecision == 0) {
    uVar18 = (ulong)((this->semantics->precision * 0x3b) / 0xc4 + 2);
  }
  if (local_198 < 0x41) {
    if ((void *)local_1a0.VAL == (void *)0x0) {
      uVar16 = 0x40;
    }
    else {
      lVar3 = 0;
      if ((void *)local_1a0.VAL != (void *)0x0) {
        for (; (local_1a0.VAL >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
        }
      }
      uVar16 = (uint)lVar3;
    }
    if (local_198 < uVar16) {
      uVar16 = local_198;
    }
  }
  else {
    uVar16 = APInt::countTrailingZerosSlowCase((APInt *)&local_1a0);
  }
  APInt::lshrInPlace((APInt *)&local_1a0,uVar16);
  uVar16 = ((int)sVar2 - uVar17) + uVar16 + 1;
  uVar17 = 0;
  local_170 = uVar18;
  if (uVar16 != 0) {
    if ((int)uVar16 < 1) {
      uVar17 = this->semantics->precision;
      APInt::zext((APInt *)&local_140,(uint)&local_1a0);
      APInt::operator=((APInt *)&local_1a0,(APInt *)&local_140);
      if ((0x40 < (uint)local_138) && ((void *)local_140.VAL != (void *)0x0)) {
        operator_delete__(local_140.pVal);
      }
      uVar10 = -uVar16;
      APInt::APInt((APInt *)&local_140,(uVar16 * -0x89 + 0x88) / 0x3b + uVar17,5,false);
      while( true ) {
        if ((uVar10 & 1) != 0) {
          APInt::operator*=((APInt *)&local_1a0,(APInt *)&local_140);
        }
        if (uVar10 < 2) break;
        uVar10 = uVar10 >> 1;
        APInt::operator*=((APInt *)&local_140,(APInt *)&local_140);
      }
      uVar17 = uVar16;
      if ((0x40 < (uint)local_138) && ((void *)local_140.VAL != (void *)0x0)) {
        operator_delete__(local_140.pVal);
      }
    }
    else {
      APInt::zext((APInt *)&local_140,(uint)&local_1a0);
      APInt::operator=((APInt *)&local_1a0,(APInt *)&local_140);
      if ((0x40 < (uint)local_138) && ((void *)local_140.VAL != (void *)0x0)) {
        operator_delete__(local_140.pVal);
      }
      APInt::operator<<=((APInt *)&local_1a0,uVar16);
    }
  }
  uVar18 = local_170;
  uVar16 = local_198;
  if (local_198 < 0x41) {
    if ((void *)local_1a0.VAL == (void *)0x0) {
      uVar10 = 0x40;
    }
    else {
      lVar3 = 0x3f;
      if ((void *)local_1a0.VAL != (void *)0x0) {
        for (; local_1a0.VAL >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      uVar10 = (uint)lVar3 ^ 0x3f;
    }
    uVar10 = (local_198 - 0x40) + uVar10;
  }
  else {
    uVar10 = APInt::countLeadingZerosSlowCase((APInt *)&local_1a0);
  }
  uVar7 = ((int)uVar18 * 0xc4 + 0x3aU) / 0x3b;
  iVar11 = (uVar16 - uVar10) - uVar7;
  if ((uVar7 <= uVar16 - uVar10 && iVar11 != 0) && (uVar10 = iVar11 * 0x3b, 0xc3 < uVar10)) {
    uVar18 = (ulong)uVar10 / 0xc4;
    APInt::APInt((APInt *)&local_140,uVar16,1,false);
    APInt::APInt((APInt *)&local_190,local_198,10,false);
    while( true ) {
      if ((uVar18 & 1) != 0) {
        APInt::operator*=((APInt *)&local_140,(APInt *)&local_190);
      }
      if ((uint)uVar18 < 2) break;
      uVar18 = (ulong)((uint)uVar18 >> 1);
      APInt::operator*=((APInt *)&local_190,(APInt *)&local_190);
    }
    APInt::udiv((APInt *)&local_160,(APInt *)&local_1a0);
    APInt::operator=((APInt *)&local_1a0,(APInt *)&local_160);
    __x = extraout_XMM0_Qa;
    if ((0x40 < local_158) && ((void *)local_160.VAL != (void *)0x0)) {
      operator_delete__(local_160.pVal);
      __x = extraout_XMM0_Qa_00;
    }
    if (local_198 < 0x41) {
      if (((void *)local_1a0.VAL != (void *)0x0) &&
         (lVar3 = 0x3f, (void *)local_1a0.VAL != (void *)0x0)) {
        for (; local_1a0.VAL >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
    }
    else {
      APInt::countLeadingZerosSlowCase((APInt *)&local_1a0);
      __x = extraout_XMM0_Qa_01;
    }
    APInt::trunc((APInt *)&local_160,__x);
    APInt::operator=((APInt *)&local_1a0,(APInt *)&local_160);
    if ((0x40 < local_158) && ((void *)local_160.VAL != (void *)0x0)) {
      operator_delete__(local_160.pVal);
    }
    if ((0x40 < (uint)local_188) && ((undefined1 *)local_190.VAL != (undefined1 *)0x0)) {
      operator_delete__(local_190.pVal);
    }
    if ((0x40 < (uint)local_138) && ((void *)local_140.VAL != (void *)0x0)) {
      operator_delete__(local_140.pVal);
    }
    uVar17 = uVar10 / 0xc4 + uVar17;
    uVar16 = local_198;
  }
  local_140.pVal = (uint64_t *)local_130;
  local_138 = 0x10000000000;
  APInt::APInt((APInt *)&local_160,uVar16,10,false);
  APInt::APInt((APInt *)&local_150,uVar16,0,false);
  bVar5 = APInt::operator==((APInt *)&local_1a0,0);
  if (!bVar5) {
    bVar5 = true;
    do {
      APInt::udivrem((APInt *)&local_1a0,(APInt *)&local_160,(APInt *)&local_1a0,(APInt *)&local_150
                    );
      uVar8 = APInt::getZExtValue((APInt *)&local_150);
      bVar5 = (bool)((int)uVar8 == 0 & bVar5);
      if (bVar5) {
        uVar17 = uVar17 + 1;
      }
      else {
        local_190.VAL._0_1_ = (char)uVar8 + '0';
        SmallVectorTemplateBase<char,_true>::push_back
                  ((SmallVectorTemplateBase<char,_true> *)&local_140,(char *)&local_190.VAL);
      }
      bVar6 = APInt::operator==((APInt *)&local_1a0,0);
    } while (!bVar6);
  }
  pSVar4 = local_168;
  if ((uint)local_138 == 0) {
    __assert_fail("!buffer.empty() && \"no characters in buffer!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xdbd,
                  "void llvm::detail::IEEEFloat::toString(SmallVectorImpl<char> &, unsigned int, unsigned int, bool) const"
                 );
  }
  uVar7 = (uint)local_170;
  uVar10 = (uint)local_138 - uVar7;
  uVar16 = (uint)local_138;
  if (uVar7 <= (uint)local_138 && uVar10 != 0) {
    if ((uint)local_138 <= uVar10 - 1) goto LAB_0019383f;
    if (*(char *)((long)local_140.pVal + (ulong)(uVar10 - 1)) < '5') {
      uVar9 = (ulong)uVar10;
      uVar18 = local_170 & 0xffffffff;
      do {
        if (*(char *)((long)local_140.pVal + uVar9) != '0') {
          if ((uint)uVar9 < (uint)local_138) {
            uVar17 = uVar17 + (uint)uVar9;
            uVar9 = uVar9 & 0xffffffff;
LAB_001938dc:
            SmallVectorImpl<char>::erase
                      ((SmallVectorImpl<char> *)&local_140,(const_iterator)local_140.pVal,
                       (const_iterator)(uVar9 + (long)local_140.pVal));
            goto LAB_001938e1;
          }
          break;
        }
        uVar9 = uVar9 + 1;
        uVar16 = (int)uVar18 - 1;
        uVar18 = (ulong)uVar16;
      } while (uVar16 != 0);
      goto LAB_0019383f;
    }
    uVar18 = local_170 & 0xffffffff;
    do {
      iVar11 = (int)uVar18;
      uVar18 = (ulong)(iVar11 - 1U);
      if (iVar11 == 0) goto LAB_0019383f;
      uVar9 = (ulong)uVar10;
      if (*(char *)((long)local_140.pVal + uVar9) != '9') {
        *(char *)((long)local_140.pVal + uVar9) = *(char *)((long)local_140.pVal + uVar9) + '\x01';
        if (((uint)local_138 == 0) || ((uint)local_138 <= uVar10)) goto LAB_0019383f;
        uVar17 = (uVar17 + (uint)local_138) - iVar11;
        goto LAB_001938dc;
      }
      uVar10 = uVar10 + 1;
    } while (iVar11 - 1U != 0);
    uVar17 = (uint)local_138 + uVar17;
    local_138 = local_138 & 0xffffffff00000000;
    local_190.VAL._0_1_ = 0x31;
    SmallVectorTemplateBase<char,_true>::push_back
              ((SmallVectorTemplateBase<char,_true> *)&local_140,(char *)&local_190.VAL);
LAB_001938e1:
    uVar16 = (uint)local_138;
  }
  if (local_178 != 0) {
    if ((int)uVar17 < 0) {
      uVar10 = uVar16 + uVar17;
      uVar18 = (ulong)uVar10;
      if (1 - uVar10 <= local_178 || -1 < (int)(uVar10 - 1)) {
        uVar17 = uVar16;
        if ((int)uVar10 < 1) {
          local_190.VAL._0_1_ = 0x30;
          SmallVectorTemplateBase<char,_true>::push_back
                    (&pSVar4->super_SmallVectorTemplateBase<char,_true>,(char *)&local_190.VAL);
          local_190.VAL._0_1_ = 0x2e;
          SmallVectorTemplateBase<char,_true>::push_back
                    (&pSVar4->super_SmallVectorTemplateBase<char,_true>,(char *)&local_190.VAL);
          if (uVar10 != 0) {
            do {
              local_190.VAL._0_1_ = 0x30;
              SmallVectorTemplateBase<char,_true>::push_back
                        (&pSVar4->super_SmallVectorTemplateBase<char,_true>,(char *)&local_190.VAL);
              uVar17 = (int)uVar18 + 1;
              uVar18 = (ulong)uVar17;
            } while (uVar17 != 0);
          }
          uVar10 = 0;
        }
        else {
          do {
            uVar17 = uVar17 - 1;
            if ((uint)local_138 <= uVar17) goto LAB_0019383f;
            SmallVectorTemplateBase<char,_true>::push_back
                      (&pSVar4->super_SmallVectorTemplateBase<char,_true>,
                       (char *)((ulong)uVar17 + (long)local_140.pVal));
            uVar18 = uVar18 - 1;
          } while (uVar18 != 0);
          local_190.VAL._0_1_ = 0x2e;
          SmallVectorTemplateBase<char,_true>::push_back
                    (&pSVar4->super_SmallVectorTemplateBase<char,_true>,(char *)&local_190.VAL);
        }
        if (uVar10 != uVar16) {
          uVar16 = ~uVar10 + uVar16;
          do {
            if ((uint)local_138 <= uVar16) goto LAB_0019383f;
            SmallVectorTemplateBase<char,_true>::push_back
                      (&pSVar4->super_SmallVectorTemplateBase<char,_true>,
                       (char *)((ulong)uVar16 + (long)local_140.pVal));
            bVar5 = uVar16 != 0;
            uVar16 = uVar16 - 1;
          } while (bVar5);
        }
        goto LAB_00193b13;
      }
    }
    else if ((uVar17 <= local_178) && (uVar16 + uVar17 <= uVar7)) {
      if (uVar16 != 0) {
        uVar18 = (ulong)uVar16;
        do {
          if ((uint)local_138 <= (uint)(uVar18 - 1)) goto LAB_0019383f;
          SmallVectorTemplateBase<char,_true>::push_back
                    (&pSVar4->super_SmallVectorTemplateBase<char,_true>,
                     (char *)((uVar18 - 1 & 0xffffffff) + (long)local_140.pVal));
          uVar18 = uVar18 - 1;
        } while (uVar18 != 0);
      }
      if (uVar17 != 0) {
        do {
          local_190.VAL._0_1_ = 0x30;
          SmallVectorTemplateBase<char,_true>::push_back
                    (&pSVar4->super_SmallVectorTemplateBase<char,_true>,(char *)&local_190.VAL);
          uVar17 = uVar17 - 1;
        } while (uVar17 != 0);
      }
      goto LAB_00193b13;
    }
  }
  if (uVar16 == 0) {
LAB_0019383f:
    __assert_fail("idx < size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                  ,0x9b,
                  "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                 );
  }
  SmallVectorTemplateBase<char,_true>::push_back
            (&pSVar4->super_SmallVectorTemplateBase<char,_true>,
             (char *)((ulong)(uVar16 - 1) + (long)local_140.pVal));
  local_190.VAL._0_1_ = 0x2e;
  SmallVectorTemplateBase<char,_true>::push_back
            (&pSVar4->super_SmallVectorTemplateBase<char,_true>,(char *)&local_190.VAL);
  if (((byte)local_174 & uVar16 == 1) == 0) {
    if (uVar16 != 1) {
      uVar10 = uVar16 - 2;
      do {
        if ((uint)local_138 <= uVar10) goto LAB_0019383f;
        SmallVectorTemplateBase<char,_true>::push_back
                  (&pSVar4->super_SmallVectorTemplateBase<char,_true>,
                   (char *)((ulong)uVar10 + (long)local_140.pVal));
        bVar5 = uVar10 != 0;
        uVar10 = uVar10 - 1;
      } while (bVar5);
    }
  }
  else {
    local_190.VAL._0_1_ = 0x30;
    SmallVectorTemplateBase<char,_true>::push_back
              (&pSVar4->super_SmallVectorTemplateBase<char,_true>,(char *)&local_190.VAL);
  }
  uVar17 = (uVar17 + uVar16) - 1;
  uVar15 = 0x45;
  if ((byte)local_174 == '\0') {
    uVar15 = 0x65;
    if (uVar16 - 1 < (uint)local_170) {
      local_190.VAL._0_1_ = 0x30;
      SmallVectorImpl<char>::append
                (local_168,(ulong)(((uint)local_170 - uVar16) + 1),(char *)&local_190.VAL);
    }
  }
  pSVar4 = local_168;
  local_190.VAL._0_1_ = uVar15;
  SmallVectorTemplateBase<char,_true>::push_back
            (&local_168->super_SmallVectorTemplateBase<char,_true>,(char *)&local_190.VAL);
  local_190.VAL._0_1_ = (char)((int)uVar17 >> 0x1f) * -2 + '+';
  SmallVectorTemplateBase<char,_true>::push_back
            (&pSVar4->super_SmallVectorTemplateBase<char,_true>,(char *)&local_190.VAL);
  uVar16 = -uVar17;
  if (0 < (int)uVar17) {
    uVar16 = uVar17;
  }
  local_188 = 0x600000000;
  local_190.pVal = (uint64_t *)local_180;
  do {
    local_1a1 = (char)uVar16 + (char)(uVar16 / 10) * -10 | 0x30;
    SmallVectorTemplateBase<char,_true>::push_back
              ((SmallVectorTemplateBase<char,_true> *)&local_190,(char *)&local_1a1);
    bVar5 = 9 < uVar16;
    uVar16 = uVar16 / 10;
  } while (bVar5);
  if ((char)local_174 == '\0' && (uint)local_188 < 2) {
    local_1a1 = 0x30;
    SmallVectorTemplateBase<char,_true>::push_back
              ((SmallVectorTemplateBase<char,_true> *)&local_190,(char *)&local_1a1);
  }
  pSVar4 = local_168;
  if ((uint)local_188 != 0) {
    uVar18 = (ulong)(uint)local_188;
    do {
      if ((uint)local_188 <= (uint)(uVar18 - 1)) goto LAB_0019383f;
      SmallVectorTemplateBase<char,_true>::push_back
                (&pSVar4->super_SmallVectorTemplateBase<char,_true>,
                 (char *)((uVar18 - 1 & 0xffffffff) + (long)local_190.pVal));
      uVar18 = uVar18 - 1;
    } while (uVar18 != 0);
  }
  if ((undefined1 *)local_190.VAL != local_180) {
    free(local_190.pVal);
  }
LAB_00193b13:
  if ((0x40 < local_148) && ((void *)local_150.VAL != (void *)0x0)) {
    operator_delete__(local_150.pVal);
  }
  if ((0x40 < local_158) && ((void *)local_160.VAL != (void *)0x0)) {
    operator_delete__(local_160.pVal);
  }
  if ((char *)local_140.VAL != local_130) {
    free(local_140.pVal);
  }
  if ((0x40 < local_198) && ((void *)local_1a0.VAL != (void *)0x0)) {
    operator_delete__(local_1a0.pVal);
  }
  return;
}

Assistant:

void IEEEFloat::toString(SmallVectorImpl<char> &Str, unsigned FormatPrecision,
                         unsigned FormatMaxPadding, bool TruncateZero) const {
  switch (category) {
  case fcInfinity:
    if (isNegative())
      return append(Str, "-Inf");
    else
      return append(Str, "+Inf");

  case fcNaN: return append(Str, "NaN");

  case fcZero:
    if (isNegative())
      Str.push_back('-');

    if (!FormatMaxPadding) {
      if (TruncateZero)
        append(Str, "0.0E+0");
      else {
        append(Str, "0.0");
        if (FormatPrecision > 1)
          Str.append(FormatPrecision - 1, '0');
        append(Str, "e+00");
      }
    } else
      Str.push_back('0');
    return;

  case fcNormal:
    break;
  }

  if (isNegative())
    Str.push_back('-');

  // Decompose the number into an APInt and an exponent.
  int exp = exponent - ((int) semantics->precision - 1);
  APInt significand(semantics->precision,
                    makeArrayRef(significandParts(),
                                 partCountForBits(semantics->precision)));

  // Set FormatPrecision if zero.  We want to do this before we
  // truncate trailing zeros, as those are part of the precision.
  if (!FormatPrecision) {
    // We use enough digits so the number can be round-tripped back to an
    // APFloat. The formula comes from "How to Print Floating-Point Numbers
    // Accurately" by Steele and White.
    // FIXME: Using a formula based purely on the precision is conservative;
    // we can print fewer digits depending on the actual value being printed.

    // FormatPrecision = 2 + floor(significandBits / lg_2(10))
    FormatPrecision = 2 + semantics->precision * 59 / 196;
  }

  // Ignore trailing binary zeros.
  int trailingZeros = significand.countTrailingZeros();
  exp += trailingZeros;
  significand.lshrInPlace(trailingZeros);

  // Change the exponent from 2^e to 10^e.
  if (exp == 0) {
    // Nothing to do.
  } else if (exp > 0) {
    // Just shift left.
    significand = significand.zext(semantics->precision + exp);
    significand <<= exp;
    exp = 0;
  } else { /* exp < 0 */
    int texp = -exp;

    // We transform this using the identity:
    //   (N)(2^-e) == (N)(5^e)(10^-e)
    // This means we have to multiply N (the significand) by 5^e.
    // To avoid overflow, we have to operate on numbers large
    // enough to store N * 5^e:
    //   log2(N * 5^e) == log2(N) + e * log2(5)
    //                 <= semantics->precision + e * 137 / 59
    //   (log_2(5) ~ 2.321928 < 2.322034 ~ 137/59)

    unsigned precision = semantics->precision + (137 * texp + 136) / 59;

    // Multiply significand by 5^e.
    //   N * 5^0101 == N * 5^(1*1) * 5^(0*2) * 5^(1*4) * 5^(0*8)
    significand = significand.zext(precision);
    APInt five_to_the_i(precision, 5);
    while (true) {
      if (texp & 1) significand *= five_to_the_i;

      texp >>= 1;
      if (!texp) break;
      five_to_the_i *= five_to_the_i;
    }
  }

  AdjustToPrecision(significand, exp, FormatPrecision);

  SmallVector<char, 256> buffer;

  // Fill the buffer.
  unsigned precision = significand.getBitWidth();
  APInt ten(precision, 10);
  APInt digit(precision, 0);

  bool inTrail = true;
  while (significand != 0) {
    // digit <- significand % 10
    // significand <- significand / 10
    APInt::udivrem(significand, ten, significand, digit);

    unsigned d = digit.getZExtValue();

    // Drop trailing zeros.
    if (inTrail && !d) exp++;
    else {
      buffer.push_back((char) ('0' + d));
      inTrail = false;
    }
  }

  assert(!buffer.empty() && "no characters in buffer!");

  // Drop down to FormatPrecision.
  // TODO: don't do more precise calculations above than are required.
  AdjustToPrecision(buffer, exp, FormatPrecision);

  unsigned NDigits = buffer.size();

  // Check whether we should use scientific notation.
  bool FormatScientific;
  if (!FormatMaxPadding)
    FormatScientific = true;
  else {
    if (exp >= 0) {
      // 765e3 --> 765000
      //              ^^^
      // But we shouldn't make the number look more precise than it is.
      FormatScientific = ((unsigned) exp > FormatMaxPadding ||
                          NDigits + (unsigned) exp > FormatPrecision);
    } else {
      // Power of the most significant digit.
      int MSD = exp + (int) (NDigits - 1);
      if (MSD >= 0) {
        // 765e-2 == 7.65
        FormatScientific = false;
      } else {
        // 765e-5 == 0.00765
        //           ^ ^^
        FormatScientific = ((unsigned) -MSD) > FormatMaxPadding;
      }
    }
  }

  // Scientific formatting is pretty straightforward.
  if (FormatScientific) {
    exp += (NDigits - 1);

    Str.push_back(buffer[NDigits-1]);
    Str.push_back('.');
    if (NDigits == 1 && TruncateZero)
      Str.push_back('0');
    else
      for (unsigned I = 1; I != NDigits; ++I)
        Str.push_back(buffer[NDigits-1-I]);
    // Fill with zeros up to FormatPrecision.
    if (!TruncateZero && FormatPrecision > NDigits - 1)
      Str.append(FormatPrecision - NDigits + 1, '0');
    // For !TruncateZero we use lower 'e'.
    Str.push_back(TruncateZero ? 'E' : 'e');

    Str.push_back(exp >= 0 ? '+' : '-');
    if (exp < 0) exp = -exp;
    SmallVector<char, 6> expbuf;
    do {
      expbuf.push_back((char) ('0' + (exp % 10)));
      exp /= 10;
    } while (exp);
    // Exponent always at least two digits if we do not truncate zeros.
    if (!TruncateZero && expbuf.size() < 2)
      expbuf.push_back('0');
    for (unsigned I = 0, E = expbuf.size(); I != E; ++I)
      Str.push_back(expbuf[E-1-I]);
    return;
  }

  // Non-scientific, positive exponents.
  if (exp >= 0) {
    for (unsigned I = 0; I != NDigits; ++I)
      Str.push_back(buffer[NDigits-1-I]);
    for (unsigned I = 0; I != (unsigned) exp; ++I)
      Str.push_back('0');
    return;
  }

  // Non-scientific, negative exponents.

  // The number of digits to the left of the decimal point.
  int NWholeDigits = exp + (int) NDigits;

  unsigned I = 0;
  if (NWholeDigits > 0) {
    for (; I != (unsigned) NWholeDigits; ++I)
      Str.push_back(buffer[NDigits-I-1]);
    Str.push_back('.');
  } else {
    unsigned NZeros = 1 + (unsigned) -NWholeDigits;

    Str.push_back('0');
    Str.push_back('.');
    for (unsigned Z = 1; Z != NZeros; ++Z)
      Str.push_back('0');
  }

  for (; I != NDigits; ++I)
    Str.push_back(buffer[NDigits-I-1]);
}